

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Robber.cpp
# Opt level: O0

bool __thiscall Robber::canStayWith(Robber *this,Container *c)

{
  Person *pPVar1;
  bool bVar2;
  bool bVar3;
  reference ppPVar4;
  size_t sVar5;
  ostream *this_00;
  Person *p;
  const_iterator __end1;
  const_iterator __begin1;
  Container *__range1;
  bool isPolicemanHere;
  Container *c_local;
  Robber *this_local;
  
  bVar2 = false;
  __end1 = Container::begin(c);
  p = (Person *)Container::end(c);
  while (bVar3 = std::operator!=(&__end1,(_Self *)&p), bVar3) {
    ppPVar4 = std::_List_const_iterator<Person_*>::operator*(&__end1);
    pPVar1 = *ppPVar4;
    if (pPVar1 == (Person *)0x0) {
      __cxa_bad_typeid();
    }
    bVar3 = std::type_info::operator==
                      ((type_info *)pPVar1->_vptr_Person[-1],(type_info *)&Policeman::typeinfo);
    if (bVar3) {
      bVar2 = true;
    }
    std::_List_const_iterator<Person_*>::operator++(&__end1);
  }
  sVar5 = Container::size(c);
  if ((sVar5 < 2) || (bVar2)) {
    this_local._7_1_ = true;
  }
  else {
    this_00 = std::operator<<((ostream *)&std::cout,"Voleur seul avec la famille sans le policier");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Robber::canStayWith(const Container &c) const {
    bool isPolicemanHere = false;

    // Iterates through the list of Person
    for (Person* p : c){
        if(typeid(*p) == typeid(Policeman)) isPolicemanHere = true;
    }

    // If there is no policeman, cannot be with other members
    if(c.size() > 1 && !isPolicemanHere) {
        std::cout << "Voleur seul avec la famille sans le policier" << std::endl;
        return false;
    }
    return true;
}